

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  bool bVar1;
  ImVector<ImDrawList_*> *this_00;
  ImDrawList **__src;
  long in_RDI;
  ImVector<ImDrawList_*> *layer;
  int layer_n;
  int i;
  int size;
  int n;
  int in_stack_ffffffffffffffcc;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffffd0;
  int local_18;
  int local_14;
  
  for (local_14 = 1; local_14 < 2; local_14 = local_14 + 1) {
  }
  ImVector<ImDrawList_*>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  for (local_18 = 1; local_18 < 2; local_18 = local_18 + 1) {
    this_00 = (ImVector<ImDrawList_*> *)(in_RDI + (long)local_18 * 0x10);
    bVar1 = ImVector<ImDrawList_*>::empty(this_00);
    if (!bVar1) {
      in_stack_ffffffffffffffd0 =
           (ImVector<ImDrawList_*> *)
           ImVector<ImDrawList_*>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      __src = ImVector<ImDrawList_*>::operator[]
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      memcpy(in_stack_ffffffffffffffd0,__src,(long)this_00->Size << 3);
      ImVector<ImDrawList_*>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}